

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_TreeFilterOne(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  int iVar1;
  int iVar2;
  uint Entry;
  uint Entry_00;
  uint uVar3;
  uint uVar4;
  Vec_Bit_t *p_00;
  Vec_Bit_t *p_01;
  bool bVar5;
  int Rank;
  int Box;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Bit_t *vMarked;
  Vec_Bit_t *vIsRoot;
  Vec_Int_t *vTree_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_BitStart(iVar1);
  Rank = 0;
  for (Box = 0; iVar1 = Vec_IntSize(vTree), Box + 1 < iVar1; Box = Box + 2) {
    iVar1 = Vec_IntEntry(vTree,Box);
    Vec_IntEntry(vTree,Box + 1);
    iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
    Vec_BitWriteEntry(p_00,iVar2,1);
    iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
    Vec_BitWriteEntry(p_00,iVar1,1);
  }
  for (Box = 0; iVar1 = Vec_IntSize(vTree), Box + 1 < iVar1; Box = Box + 2) {
    iVar1 = Vec_IntEntry(vTree,Box);
    Vec_IntEntry(vTree,Box + 1);
    iVar2 = Vec_IntEntry(vAdds,iVar1 * 6);
    Vec_BitWriteEntry(p_00,iVar2,0);
    iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 1);
    Vec_BitWriteEntry(p_00,iVar2,0);
    iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
    Vec_BitWriteEntry(p_00,iVar1,0);
  }
  Box = 0;
  while( true ) {
    bVar5 = false;
    if (Box < p->nObjs) {
      _k = Gia_ManObj(p,Box);
      bVar5 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(_k);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(_k,Box);
      iVar1 = Vec_BitEntry(p_00,iVar1);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFaninId1(_k,Box);
        iVar1 = Vec_BitEntry(p_00,iVar1);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjFaninId0(_k,Box);
          iVar1 = Vec_BitEntry(p_01,iVar1);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjFaninId1(_k,Box);
            iVar1 = Vec_BitEntry(p_01,iVar1);
            if (iVar1 == 0) goto LAB_008373b7;
          }
        }
      }
      Vec_BitWriteEntry(p_01,Box,1);
    }
LAB_008373b7:
    Box = Box + 1;
  }
  Box = 0;
  do {
    iVar1 = Vec_IntSize(vTree);
    if (iVar1 <= Box + 1) {
      Vec_IntShrink(vTree,Rank);
      Vec_BitFree(p_00);
      Vec_BitFree(p_01);
      return;
    }
    Entry = Vec_IntEntry(vTree,Box);
    Entry_00 = Vec_IntEntry(vTree,Box + 1);
    iVar1 = Vec_IntEntry(vAdds,Entry * 6 + 3);
    iVar1 = Vec_BitEntry(p_01,iVar1);
    if (iVar1 == 0) {
      iVar1 = Vec_IntEntry(vAdds,Entry * 6 + 4);
      iVar1 = Vec_BitEntry(p_01,iVar1);
      if (iVar1 != 0) goto LAB_0083749a;
      iVar1 = Rank + 1;
      Vec_IntWriteEntry(vTree,Rank,Entry);
      Rank = Rank + 2;
      Vec_IntWriteEntry(vTree,iVar1,Entry_00);
    }
    else {
LAB_0083749a:
      uVar3 = Vec_IntEntry(vAdds,Entry * 6 + 3);
      uVar4 = Vec_IntEntry(vAdds,Entry * 6 + 4);
      printf("Removing box %d=(%d,%d) of rank %d.\n",(ulong)Entry,(ulong)uVar3,(ulong)uVar4,
             (ulong)Entry_00);
    }
    Box = Box + 2;
  } while( true );
}

Assistant:

void Acec_TreeFilterOne( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vMarked = Vec_BitStart( Gia_ManObjNum(p) ) ;
    Gia_Obj_t * pObj;
    int i, k = 0, Box, Rank;
    // mark roots
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
    }
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+0), 0 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+1), 0 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+2), 0 );
    }
    // iterate through nodes to detect TFO of roots
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_BitEntry(vIsRoot, Gia_ObjFaninId0(pObj,i)) || Vec_BitEntry(vIsRoot, Gia_ObjFaninId1(pObj,i)) ||
             Vec_BitEntry(vMarked, Gia_ObjFaninId0(pObj,i)) || Vec_BitEntry(vMarked, Gia_ObjFaninId1(pObj,i)) )
            Vec_BitWriteEntry( vMarked, i, 1 );
    }
    // remove those that overlap with roots
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        // special case of the first bit
//        if ( i == 0 )
//            continue;

/*
        if ( Vec_IntEntry(vAdds, 6*Box+3) == 24 && Vec_IntEntry(vAdds, 6*Box+4) == 22 )
        {
            printf( "**** removing special one \n" );
            continue;
        }
        if ( Vec_IntEntry(vAdds, 6*Box+3) == 48 && Vec_IntEntry(vAdds, 6*Box+4) == 49 )
        {
            printf( "**** removing special one \n" );
            continue;
        }
*/
        if ( Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+3)) || Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+4)) )
        {
            printf( "Removing box %d=(%d,%d) of rank %d.\n", Box, Vec_IntEntry(vAdds, 6*Box+3), Vec_IntEntry(vAdds, 6*Box+4), Rank ); 
            continue;
        }
        Vec_IntWriteEntry( vTree, k++, Box );
        Vec_IntWriteEntry( vTree, k++, Rank );
    }
    Vec_IntShrink( vTree, k );
    Vec_BitFree( vIsRoot );
    Vec_BitFree( vMarked );
}